

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_cpool_do_locked(Curl_easy *data,connectdata *conn,Curl_cpool_conn_do_cb *cb,void *cbdata)

{
  cpool *pcVar1;
  cpool *cpool;
  void *cbdata_local;
  Curl_cpool_conn_do_cb *cb_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pcVar1 = cpool_get_instance(data);
  if (pcVar1 == (cpool *)0x0) {
    (*cb)(conn,data,cbdata);
  }
  else {
    if (pcVar1 != (cpool *)0x0) {
      if ((pcVar1->share != (Curl_share *)0x0) && ((pcVar1->share->specifier & 0x20) != 0)) {
        Curl_share_lock(pcVar1->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      pcVar1->field_0x98 = pcVar1->field_0x98 & 0xfe | 1;
    }
    (*cb)(conn,data,cbdata);
    if (((pcVar1 != (cpool *)0x0) &&
        (pcVar1->field_0x98 = pcVar1->field_0x98 & 0xfe, pcVar1->share != (Curl_share *)0x0)) &&
       ((pcVar1->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(pcVar1->idata,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_cpool_do_locked(struct Curl_easy *data,
                          struct connectdata *conn,
                          Curl_cpool_conn_do_cb *cb, void *cbdata)
{
  struct cpool *cpool = cpool_get_instance(data);
  if(cpool) {
    CPOOL_LOCK(cpool);
    cb(conn, data, cbdata);
    CPOOL_UNLOCK(cpool);
  }
  else
    cb(conn, data, cbdata);
}